

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O1

FlagTypes Js::ConfigFlagsTable::GetFlagType(Flag flag)

{
  FlagTypes FVar1;
  undefined2 in_register_0000003a;
  
  FVar1 = InvalidFlagType;
  if (CONCAT22(in_register_0000003a,flag) < 0x1d6) {
    FVar1 = *(FlagTypes *)(&DAT_002e03f0 + (ulong)flag * 2);
  }
  return FVar1;
}

Assistant:

FlagTypes
    ConfigFlagsTable::GetFlagType(Flag flag)
    {
        switch(flag)
        {
    #define FLAG(type, name, ...) \
            case name##Flag : \
                return Flag##type; \

    #include "ConfigFlagsList.h"

            default:
                return InvalidFlagType;
        }
    }